

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *cur,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
              out)

{
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  __result;
  transform_op tVar1;
  bool bVar2;
  uint uVar3;
  reference pcVar4;
  difference_type dVar5;
  traits<char> *ptVar6;
  const_reference pvVar7;
  undefined8 in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  uint *puVar8;
  ulong uVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  char *in_RSI;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *in_RDI;
  int sub;
  char_type ch;
  converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
  converter;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd28;
  int iVar10;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *in_stack_fffffffffffffd30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd38;
  char cVar11;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *iter;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *pcVar12;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb0;
  traits<char> *in_stack_fffffffffffffdb8;
  transform_op in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  traits<char> *local_208;
  undefined8 local_200;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_1f0;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_1d8;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_1c0;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_1a8;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_190;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_178;
  char *local_160;
  char *local_158;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_150;
  undefined8 local_138;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  char *local_128;
  char *local_120;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_118;
  undefined8 local_100;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_f8;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_e0;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_c8;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_b0;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_98;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_80;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char local_41;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  undefined8 local_8;
  
  iter = (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
          *)&stack0x00000008;
  __first._M_current = (char *)in_RDI;
  local_18 = in_RDX;
  local_8 = in_RCX;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&local_20);
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (bVar2) {
    detail::
    case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
    ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
    detail::
    case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
    ::operator*(&local_40);
    detail::
    case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
    ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                 *)in_stack_fffffffffffffd40._M_current,cVar11);
    (((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
       *)__first._M_current)->out_).container = (iter->out_).container;
    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      *)__first._M_current)->traits_ = iter->traits_;
    tVar1 = iter->rest_;
    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      *)__first._M_current)->next_ = iter->next_;
    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      *)__first._M_current)->rest_ = tVar1;
  }
  else {
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(in_stack_fffffffffffffd38._M_current,
                            (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
    local_41 = *pcVar4;
    __last._M_current = (char *)(ulong)((int)local_41 - 0x45);
    puVar8 = &switchD_001857ac::switchdataD_001d8718;
    iVar10 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    switch(__last._M_current) {
    case (char *)0x0:
      bVar2 = detail::set_transform(iter,op_none,scope_rest);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      if (!bVar2) {
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_1f0);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,cVar11);
      }
      break;
    default:
      ptVar6 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                         ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                          (in_RSI + 0x80));
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      iVar10 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
      uVar3 = (*ptVar6->_vptr_traits[5])
                        (ptVar6,(ulong)(uint)(int)local_41,10,
                         CONCAT71((int7)((ulong)puVar8 >> 8),local_41));
      uVar9 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,iVar10);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)&stack0xfffffffffffffdb0);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,cVar11);
      }
      else {
        ptVar6 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                           ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                            (in_RSI + 0x80));
        (*ptVar6->_vptr_traits[5])
                  (ptVar6,(ulong)(uint)(int)local_41,10,CONCAT71((int7)(uVar9 >> 8),local_41));
        pvVar7 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffd50._M_current,
                              CONCAT17(in_stack_fffffffffffffd4f,
                                       CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)
                                      ));
        if ((pvVar7->matched & 1U) != 0) {
          detail::
          sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffd50._M_current,
                       CONCAT17(in_stack_fffffffffffffd4f,
                                CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
          detail::
          sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffd50._M_current,
                       CONCAT17(in_stack_fffffffffffffd4f,
                                CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
          __result.traits_ = (traits<char> *)in_RSI;
          __result.out_.container =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iter;
          __result._16_8_ = in_stack_fffffffffffffdb0.container;
          std::
          copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                    (__first,__last,__result);
          pcVar12 = iter;
          (iter->out_).container = local_210;
          iter->traits_ = local_208;
          iter->next_ = (undefined4)local_200;
          iter->rest_ = local_200._4_4_;
          iter = pcVar12;
        }
      }
      break;
    case (char *)0x7:
      bVar2 = detail::set_transform(iter,op_lower,scope_rest);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      if (!bVar2) {
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_1a8);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,cVar11);
      }
      break;
    case (char *)0x10:
      bVar2 = detail::set_transform(iter,op_upper,scope_rest);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      if (!bVar2) {
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_1d8);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,cVar11);
      }
      break;
    case (char *)0x1c:
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_68);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x1e:
      __gnu_cxx::operator!=
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      iVar10 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
      detail::ensure_((bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0,
                      (char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0.container,
                      in_RSI,(unsigned_long)iter);
      ptVar6 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                         ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                          (in_RSI + 0x80));
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
      uVar3 = (*ptVar6->_vptr_traits[4])(ptVar6,0x61,0x7a,(ulong)(uint)(int)*pcVar4);
      if ((uVar3 & 1) == 0) {
        ptVar6 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                           ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                            (in_RSI + 0x80));
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_18);
        (*ptVar6->_vptr_traits[4])(ptVar6,0x41,0x5a,(ulong)(uint)(int)*pcVar4);
      }
      detail::ensure_((bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0,
                      (char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0.container,
                      in_RSI,(unsigned_long)iter);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(local_18);
      numeric::
      converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
      ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                    *)in_stack_fffffffffffffd30,iVar10);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_178);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_18);
      break;
    case (char *)0x20:
      numeric::
      converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
      ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                    *)in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_80);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x21:
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_98);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x27:
      bVar2 = detail::set_transform(iter,op_lower,scope_next);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      if (!bVar2) {
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_190);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,cVar11);
      }
      break;
    case (char *)0x29:
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_b0);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x2d:
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_c8);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x2f:
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_e0);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x30:
      bVar2 = detail::set_transform(iter,op_upper,scope_next);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      if (!bVar2) {
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_1c0);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,cVar11);
      }
      break;
    case (char *)0x31:
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++(in_stack_fffffffffffffd30,iVar10);
      cVar11 = (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_f8);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)in_stack_fffffffffffffd40._M_current,cVar11);
      break;
    case (char *)0x33:
      __gnu_cxx::operator!=
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      detail::ensure_((bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0,
                      (char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0.container,
                      in_RSI,(unsigned_long)iter);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
      if (*pcVar4 == '{') {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_18);
        __gnu_cxx::operator!=
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        detail::ensure_((bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0,
                        (char *)in_stack_fffffffffffffdb8,
                        (char *)in_stack_fffffffffffffdb0.container,in_RSI,(unsigned_long)iter);
        local_20._M_current = local_18->_M_current;
        local_100 = local_8;
        intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator*
                  ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)(in_RSI + 0x80));
        detail::
        toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                   in_stack_fffffffffffffd50,(traits<char> *)in_stack_fffffffffffffd40._M_current,
                   (int)((ulong)in_stack_fffffffffffffd38._M_current >> 0x20),
                   (int)in_stack_fffffffffffffd38._M_current);
        numeric::
        converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
        ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                      *)in_stack_fffffffffffffd30,
                     (argument_type)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_118);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,
                    (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38));
        local_120 = local_20._M_current;
        local_128 = local_18->_M_current;
        dVar5 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        if ((dVar5 == 4) &&
           (bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28), bVar2)) {
          local_130 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++(in_stack_fffffffffffffd38._M_current,
                                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_130);
        }
        detail::ensure_((bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0,
                        (char *)in_stack_fffffffffffffdb8,
                        (char *)in_stack_fffffffffffffdb0.container,in_RSI,(unsigned_long)iter);
      }
      else {
        local_20._M_current = local_18->_M_current;
        local_138 = local_8;
        intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator*
                  ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)(in_RSI + 0x80));
        iVar10 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
        detail::
        toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                   in_stack_fffffffffffffd50,(traits<char> *)in_stack_fffffffffffffd40._M_current,
                   (int)((ulong)in_stack_fffffffffffffd38._M_current >> 0x20),
                   (int)in_stack_fffffffffffffd38._M_current);
        numeric::
        converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
        ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                      *)in_stack_fffffffffffffd30,iVar10);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator++(in_stack_fffffffffffffd30,iVar10);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator*(&local_150);
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)in_stack_fffffffffffffd40._M_current,
                    (char)((ulong)in_stack_fffffffffffffd38._M_current >> 0x38));
        local_158 = local_20._M_current;
        local_160 = local_18->_M_current;
        std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        detail::ensure_((bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0,
                        (char *)in_stack_fffffffffffffdb8,
                        (char *)in_stack_fffffffffffffdb0.container,in_RSI,(unsigned_long)iter);
      }
    }
    (((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
       *)__first._M_current)->out_).container = (iter->out_).container;
    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      *)__first._M_current)->traits_ = iter->traits_;
    tVar1 = iter->rest_;
    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      *)__first._M_current)->next_ = iter->next_;
    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      *)__first._M_current)->rest_ = tVar1;
  }
  return in_RDI;
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }